

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O1

int __thiscall CNetServer::Send(CNetServer *this,CNetChunk *pChunk,TOKEN Token)

{
  int iVar1;
  TOKEN ResponseToken;
  char *fmt;
  char *sys;
  NETADDR *b;
  long lVar2;
  
  if ((pChunk->m_Flags & 2) == 0) {
    if (pChunk->m_DataSize < 0x56c) {
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network_server.cpp"
                     ,0x120,(uint)~pChunk->m_ClientID >> 0x1f,"errornous client id");
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network_server.cpp"
                     ,0x121,(uint)(pChunk->m_ClientID < 0x40),"errornous client id");
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network_server.cpp"
                     ,0x122,(uint)(this->m_aSlots[pChunk->m_ClientID].m_Connection.m_State != 0),
                     "errornous client id");
      iVar1 = CNetConnection::QueueChunk
                        (&this->m_aSlots[pChunk->m_ClientID].m_Connection,pChunk->m_Flags & 1,
                         pChunk->m_DataSize,pChunk->m_pData);
      if (iVar1 != 0) {
        Drop(this,pChunk->m_ClientID,"Error sending data");
        return 0;
      }
      if ((pChunk->m_Flags & 4) != 0) {
        CNetConnection::Flush(&this->m_aSlots[pChunk->m_ClientID].m_Connection);
        return 0;
      }
      return 0;
    }
    sys = "netclient";
    fmt = "chunk payload too big. %d. dropping chunk";
  }
  else {
    if (pChunk->m_DataSize < 0x56f) {
      if (pChunk->m_ClientID == -1) {
        b = &this->m_aSlots[0].m_Connection.m_PeerAddr;
        lVar2 = 0;
        do {
          if ((*(int *)(b[-0x59f].ip + 4) != 0) &&
             (iVar1 = net_addr_comp(&pChunk->m_Address,b,1), iVar1 == 0)) {
            pChunk->m_ClientID = (int)lVar2;
            break;
          }
          lVar2 = lVar2 + 1;
          b = b + 0x5a1;
        } while (lVar2 != 0x40);
      }
      if (Token != 0xffffffff) {
        ResponseToken = CNetTokenManager::GenerateToken(&this->m_TokenManager,&pChunk->m_Address);
        CNetBase::SendPacketConnless
                  (&this->super_CNetBase,&pChunk->m_Address,Token,ResponseToken,pChunk->m_pData,
                   pChunk->m_DataSize);
        return 0;
      }
      if (pChunk->m_ClientID != 0xffffffff) {
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network_server.cpp"
                       ,0x10f,(uint)~pChunk->m_ClientID >> 0x1f,"errornous client id");
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network_server.cpp"
                       ,0x110,(uint)(pChunk->m_ClientID < 0x40),"errornous client id");
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network_server.cpp"
                       ,0x111,(uint)(this->m_aSlots[pChunk->m_ClientID].m_Connection.m_State != 0),
                       "errornous client id");
        CNetConnection::SendPacketConnless
                  (&this->m_aSlots[pChunk->m_ClientID].m_Connection,(char *)pChunk->m_pData,
                   pChunk->m_DataSize);
        return 0;
      }
      CNetTokenCache::SendPacketConnless
                (&this->m_TokenCache,&pChunk->m_Address,pChunk->m_pData,pChunk->m_DataSize,
                 (CSendCBData *)0x0);
      return 0;
    }
    sys = "netserver";
    fmt = "packet payload too big. %d. dropping packet";
  }
  dbg_msg(sys,fmt);
  return -1;
}

Assistant:

int CNetServer::Send(CNetChunk *pChunk, TOKEN Token)
{
	if(pChunk->m_Flags&NETSENDFLAG_CONNLESS)
	{
		if(pChunk->m_DataSize >= NET_MAX_PAYLOAD)
		{
			dbg_msg("netserver", "packet payload too big. %d. dropping packet", pChunk->m_DataSize);
			return -1;
		}

		if(pChunk->m_ClientID == -1)
		{
			for(int i = 0; i < NET_MAX_CLIENTS; i++)
			{
				if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
					continue;

				if(net_addr_comp(&pChunk->m_Address, m_aSlots[i].m_Connection.PeerAddress(), true) == 0)
				{
					// upgrade the packet, now that we know its recipent
					pChunk->m_ClientID = i;
					break;
				}
			}
		}

		if(Token != NET_TOKEN_NONE)
		{
			SendPacketConnless(&pChunk->m_Address, Token, m_TokenManager.GenerateToken(&pChunk->m_Address), pChunk->m_pData, pChunk->m_DataSize);
		}
		else
		{
			if(pChunk->m_ClientID == -1)
			{
				m_TokenCache.SendPacketConnless(&pChunk->m_Address, pChunk->m_pData, pChunk->m_DataSize);
			}
			else
			{
				dbg_assert(pChunk->m_ClientID >= 0, "errornous client id");
				dbg_assert(pChunk->m_ClientID < NET_MAX_CLIENTS, "errornous client id");
				dbg_assert(m_aSlots[pChunk->m_ClientID].m_Connection.State() != NET_CONNSTATE_OFFLINE, "errornous client id");

				m_aSlots[pChunk->m_ClientID].m_Connection.SendPacketConnless((const char *)pChunk->m_pData, pChunk->m_DataSize);
			}
		}
	}
	else
	{
		if(pChunk->m_DataSize+NET_MAX_CHUNKHEADERSIZE >= NET_MAX_PAYLOAD)
		{
			dbg_msg("netclient", "chunk payload too big. %d. dropping chunk", pChunk->m_DataSize);
			return -1;
		}

		int Flags = 0;
		dbg_assert(pChunk->m_ClientID >= 0, "errornous client id");
		dbg_assert(pChunk->m_ClientID < NET_MAX_CLIENTS, "errornous client id");
		dbg_assert(m_aSlots[pChunk->m_ClientID].m_Connection.State() != NET_CONNSTATE_OFFLINE, "errornous client id");

		if(pChunk->m_Flags&NETSENDFLAG_VITAL)
			Flags = NET_CHUNKFLAG_VITAL;

		if(m_aSlots[pChunk->m_ClientID].m_Connection.QueueChunk(Flags, pChunk->m_DataSize, pChunk->m_pData) == 0)
		{
			if(pChunk->m_Flags&NETSENDFLAG_FLUSH)
				m_aSlots[pChunk->m_ClientID].m_Connection.Flush();
		}
		else
		{
			Drop(pChunk->m_ClientID, "Error sending data");
		}
	}
	return 0;
}